

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Validator::get_description_abi_cxx11_(string *__return_storage_ptr__,Validator *this)

{
  if (this->active_ == true) {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(__return_storage_ptr__,&this->desc_function_);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_description() const {
        if(active_) {
            return desc_function_();
        }
        return std::string{};
    }